

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_28c2bc::SQLiteBuildDB::setCurrentIteration
          (SQLiteBuildDB *this,uint64_t value,string *error_out)

{
  int iVar1;
  int __oflag;
  bool bVar2;
  sqlite3_stmt *stmt;
  string local_48;
  
  std::mutex::lock(&this->dbMutex);
  iVar1 = open(this,(char *)error_out,__oflag);
  if ((char)iVar1 != '\0') {
    iVar1 = sqlite3_prepare_v2(this->db,"UPDATE info SET iteration = ? WHERE id == 0;",
                               0xffffffffffffffff,&stmt,0);
    if (iVar1 == 0) {
      iVar1 = sqlite3_bind_int64(stmt,1,value);
      if (iVar1 == 0) {
        iVar1 = sqlite3_step(stmt);
        if (iVar1 == 0x65) {
          sqlite3_finalize(stmt);
          bVar2 = true;
          goto LAB_0015646a;
        }
        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_48,this);
        std::__cxx11::string::operator=((string *)error_out,(string *)&local_48);
        std::__cxx11::string::_M_dispose();
        sqlite3_finalize(stmt);
        goto LAB_00156468;
      }
    }
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_48,this);
    std::__cxx11::string::operator=((string *)error_out,(string *)&local_48);
    std::__cxx11::string::_M_dispose();
  }
LAB_00156468:
  bVar2 = false;
LAB_0015646a:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return bVar2;
}

Assistant:

virtual bool setCurrentIteration(uint64_t value, std::string *error_out) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    if (!open(error_out)) {
      return false;
    }

    sqlite3_stmt* stmt;
    int result;
    result = sqlite3_prepare_v2(
      db, "UPDATE info SET iteration = ? WHERE id == 0;",
      -1, &stmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(stmt, /*index=*/1, value);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_step(stmt);
    if (result != SQLITE_DONE) {
      *error_out = getCurrentErrorMessage();
      sqlite3_finalize(stmt);
      return false;
    }

    sqlite3_finalize(stmt);
    return true;
  }